

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

QStringList * __thiscall QSQLiteDriver::tables(QSQLiteDriver *this,TableType type)

{
  QLatin1StringView latin1;
  bool bVar1;
  ulong uVar2;
  QSqlResult *pQVar3;
  uint in_EDX;
  QLatin1String *in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QStringList *res;
  QString sql;
  QSqlQuery q;
  rvalue_ref in_stack_fffffffffffffe98;
  QStringList *str;
  QString *in_stack_fffffffffffffeb8;
  char *pcVar5;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  QChar in_stack_fffffffffffffefe;
  QChar local_d2;
  QLatin1StringView local_d0;
  QChar local_a2;
  QLatin1StringView local_a0;
  QChar local_72;
  QLatin1StringView local_70;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  str = in_RDI;
  QList<QString>::QList((QList<QString> *)0x118c4b);
  uVar2 = (**(code **)&((DataPointer *)&in_RSI->m_size)->d[6].super_QArrayData)();
  if ((uVar2 & 1) != 0) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = (QSqlResult *)
             (*(code *)((DataPointer *)&in_RSI->m_size)->d[0xc].super_QArrayData.alloc)();
    QSqlQuery::QSqlQuery((QSqlQuery *)&local_30,pQVar3);
    QSqlQuery::setForwardOnly(SUB81(&local_30,0));
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QVar4 = Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
    pcVar5 = QVar4.m_data;
    QVar4.m_data._0_4_ = in_stack_fffffffffffffed8;
    QVar4.m_size = (qsizetype)pcVar5;
    QVar4.m_data._4_4_ = in_stack_fffffffffffffedc;
    QString::QString((QString *)in_RSI,QVar4);
    if (((in_EDX & 1) == 0) || ((in_EDX & 4) == 0)) {
      if ((in_EDX & 1) == 0) {
        if ((in_EDX & 4) == 0) {
          QString::clear((QString *)in_RDI);
        }
        else {
          local_d0 = Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
          QChar::QChar<char16_t,_true>(&local_d2,L' ');
          QString::arg<QLatin1String,_true>
                    (in_stack_fffffffffffffeb8,in_RSI,(int)((ulong)str >> 0x20),
                     in_stack_fffffffffffffefe);
          QString::operator=((QString *)in_RDI,in_stack_fffffffffffffe98);
          QString::~QString((QString *)0x118ec7);
        }
      }
      else {
        local_a0 = Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
        QChar::QChar<char16_t,_true>(&local_a2,L' ');
        QString::arg<QLatin1String,_true>
                  (in_stack_fffffffffffffeb8,in_RSI,(int)((ulong)str >> 0x20),
                   in_stack_fffffffffffffefe);
        QString::operator=((QString *)in_RDI,in_stack_fffffffffffffe98);
        QString::~QString((QString *)0x118e39);
      }
    }
    else {
      local_70 = Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
      QChar::QChar<char16_t,_true>(&local_72,L' ');
      QString::arg<QLatin1String,_true>
                (in_stack_fffffffffffffeb8,in_RSI,(int)((ulong)str >> 0x20),
                 in_stack_fffffffffffffefe);
      QString::operator=((QString *)in_RDI,in_stack_fffffffffffffe98);
      QString::~QString((QString *)0x118da7);
    }
    bVar1 = QString::isEmpty((QString *)0x118ee7);
    if ((!bVar1) && (uVar2 = QSqlQuery::exec((QString *)&local_30), (uVar2 & 1) != 0)) {
      while (uVar2 = QSqlQuery::next(), (uVar2 & 1) != 0) {
        QSqlQuery::value((int)&local_28);
        QVariant::toString();
        QList<QString>::append(in_RDI,in_stack_fffffffffffffe98);
        QString::~QString((QString *)0x118f61);
        QVariant::~QVariant(&local_28);
      }
    }
    if ((in_EDX & 2) != 0) {
      Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
      latin1.m_data._0_4_ = in_stack_fffffffffffffed8;
      latin1.m_size = (qsizetype)pcVar5;
      latin1.m_data._4_4_ = in_stack_fffffffffffffedc;
      QString::QString((QString *)in_RSI,latin1);
      QList<QString>::append(in_RDI,in_stack_fffffffffffffe98);
      QString::~QString((QString *)0x118fc6);
    }
    QString::~QString((QString *)0x118fe0);
    QSqlQuery::~QSqlQuery((QSqlQuery *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return str;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QSQLiteDriver::tables(QSql::TableType type) const
{
    QStringList res;
    if (!isOpen())
        return res;

    QSqlQuery q(createResult());
    q.setForwardOnly(true);

    QString sql = "SELECT name FROM sqlite_master WHERE %1 "
                  "UNION ALL SELECT name FROM sqlite_temp_master WHERE %1"_L1;
    if ((type & QSql::Tables) && (type & QSql::Views))
        sql = sql.arg("type='table' OR type='view'"_L1);
    else if (type & QSql::Tables)
        sql = sql.arg("type='table'"_L1);
    else if (type & QSql::Views)
        sql = sql.arg("type='view'"_L1);
    else
        sql.clear();

    if (!sql.isEmpty() && q.exec(sql)) {
        while(q.next())
            res.append(q.value(0).toString());
    }

    if (type & QSql::SystemTables) {
        // there are no internal tables beside this one:
        res.append("sqlite_master"_L1);
    }

    return res;
}